

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O1

wstring * __thiscall
JSONValue::StringifyImpl_abi_cxx11_
          (wstring *__return_storage_ptr__,JSONValue *this,size_t indentDepth)

{
  wstring *pwVar1;
  _Rb_tree_node_base *p_Var2;
  wstring *pwVar3;
  wchar_t *pwVar4;
  pointer ppJVar5;
  wchar_t wVar6;
  size_t indentDepth_00;
  wstring indentStr1;
  wstring indentStr;
  wstringstream ss;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_220;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_200;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_1c0;
  wstring local_1b8 [4];
  ios_base local_138 [264];
  
  local_1c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  indentDepth_00 = indentDepth + 1;
  if (indentDepth == 0) {
    indentDepth_00 = 0;
  }
  wVar6 = (int)indentDepth * 2 + L'\xfffffffe';
  if (indentDepth == 0) {
    wVar6 = L'\0';
  }
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&local_1e0,wVar6);
  wVar6 = (int)indentDepth_00 * 2 + L'\xfffffffe';
  if (indentDepth_00 == 0) {
    wVar6 = L'\0';
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&local_200,wVar6);
  pwVar4 = L"null";
  switch(this->type) {
  case JSONType_Null:
    break;
  case JSONType_String:
    StringifyString(local_1b8,(this->field_1).string_value);
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)local_1b8);
    pwVar1 = local_1b8;
    local_220._M_dataplus._M_p = local_1b8[0]._M_dataplus._M_p;
    goto LAB_00173a26;
  case JSONType_Bool:
    pwVar4 = L"false";
    if ((this->field_1).bool_value != false) {
      pwVar4 = L"true";
    }
    break;
  case JSONType_Number:
    if (((ulong)(this->field_1).string_value & 0x7fffffffffffffff) < 0x7ff0000000000000) {
      std::__cxx11::wstringstream::wstringstream((wstringstream *)local_1b8);
      *(undefined8 *)
       ((long)&local_1b8[0]._M_string_length + *(long *)(local_1b8[0]._M_dataplus._M_p + -6)) = 0xf;
      std::wostream::_M_insert<double>((this->field_1).number_value);
      std::__cxx11::wstringbuf::str();
      std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      goto switchD_001735cc_default;
    }
    break;
  case JSONType_Array:
    if (indentDepth == 0) {
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1b8,L"[",L"",L"null",4);
    }
    else {
      std::operator+(local_1b8,L"[\n",&local_200);
    }
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p);
    }
    ppJVar5 = (((this->field_1).array_value)->
              super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppJVar5 !=
        (((this->field_1).array_value)->
        super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        StringifyImpl_abi_cxx11_(local_1b8,*ppJVar5,indentDepth_00);
        std::__cxx11::wstring::_M_append
                  ((wchar_t *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p);
        }
        ppJVar5 = ppJVar5 + 1;
        if (ppJVar5 != (pointer)((this->field_1).string_value)->_M_string_length) {
          std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
        }
      } while (ppJVar5 != (pointer)((this->field_1).string_value)->_M_string_length);
    }
    if (indentDepth == 0) {
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1b8,L"]",L"");
    }
    else {
      std::operator+(&local_220,L"\n",&local_1e0);
      pwVar3 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_220);
      std::__cxx11::wstring::wstring((wstring *)local_1b8,pwVar3);
    }
    std::__cxx11::wstring::_M_append
              ((wchar_t *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
    goto LAB_00173a01;
  case JSONType_Object:
    if (indentDepth == 0) {
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1b8,L"{",L"",L"null",4);
    }
    else {
      std::operator+(local_1b8,L"{\n",&local_200);
    }
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p);
    }
    p_Var2 = *(_Rb_tree_node_base **)((long)&((this->field_1).string_value)->field_2 + 8);
    if (p_Var2 != (_Rb_tree_node_base *)&((this->field_1).string_value)->_M_string_length) {
      do {
        StringifyString(local_1b8,(wstring *)(p_Var2 + 1));
        std::__cxx11::wstring::_M_append
                  ((wchar_t *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p);
        }
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
        StringifyImpl_abi_cxx11_(local_1b8,*(JSONValue **)(p_Var2 + 2),indentDepth_00);
        std::__cxx11::wstring::_M_append
                  ((wchar_t *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p);
        }
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
        if (p_Var2 != (_Rb_tree_node_base *)&((this->field_1).string_value)->_M_string_length) {
          std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
        }
      } while (p_Var2 != (_Rb_tree_node_base *)&((this->field_1).string_value)->_M_string_length);
    }
    if (indentDepth == 0) {
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1b8,L"}",L"");
    }
    else {
      std::operator+(&local_220,L"\n",&local_1e0);
      pwVar3 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_220);
      std::__cxx11::wstring::wstring((wstring *)local_1b8,pwVar3);
    }
    std::__cxx11::wstring::_M_append
              ((wchar_t *)__return_storage_ptr__,(ulong)local_1b8[0]._M_dataplus._M_p);
LAB_00173a01:
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p);
    }
    if (indentDepth != 0) {
      pwVar1 = &local_220;
LAB_00173a26:
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_220._M_dataplus._M_p != &pwVar1->field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
    }
  default:
    goto switchD_001735cc_default;
  }
  std::__cxx11::wstring::_M_replace
            ((ulong)__return_storage_ptr__,0,(wchar_t *)__return_storage_ptr__->_M_string_length,
             (ulong)pwVar4);
switchD_001735cc_default:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring JSONValue::StringifyImpl(size_t const indentDepth) const
{
	std::wstring ret_string;
	size_t const indentDepth1 = indentDepth ? indentDepth + 1 : 0;
	std::wstring const indentStr = Indent(indentDepth);
	std::wstring const indentStr1 = Indent(indentDepth1);

	switch (type)
	{
		case JSONType_Null:
			ret_string = L"null";
			break;

		case JSONType_String:
			ret_string = StringifyString(*string_value);
			break;

		case JSONType_Bool:
			ret_string = bool_value ? L"true" : L"false";
			break;

		case JSONType_Number:
		{
			if (isinf(number_value) || isnan(number_value))
				ret_string = L"null";
			else
			{
				std::wstringstream ss;
				ss.precision(15);
				ss << number_value;
				ret_string = ss.str();
			}
			break;
		}

		case JSONType_Array:
		{
			ret_string = indentDepth ? L"[\n" + indentStr1 : L"[";
			JSONArray::const_iterator iter = array_value->begin();
			while (iter != array_value->end())
			{
				ret_string += (*iter)->StringifyImpl(indentDepth1);

				// Not at the end - add a separator
				if (++iter != array_value->end())
					ret_string += L",";
			}
			ret_string += indentDepth ? L"\n" + indentStr + L"]" : L"]";
			break;
		}

		case JSONType_Object:
		{
			ret_string = indentDepth ? L"{\n" + indentStr1 : L"{";
			JSONObject::const_iterator iter = object_value->begin();
			while (iter != object_value->end())
			{
				ret_string += StringifyString((*iter).first);
				ret_string += L":";
				ret_string += (*iter).second->StringifyImpl(indentDepth1);

				// Not at the end - add a separator
				if (++iter != object_value->end())
					ret_string += L",";
			}
			ret_string += indentDepth ? L"\n" + indentStr + L"}" : L"}";
			break;
		}
	}

	return ret_string;
}